

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ModSystem.cpp
# Opt level: O3

void __thiscall
AddIRCCommand::trigger
          (AddIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  Server *server;
  PlayerInfo *player;
  undefined8 uVar6;
  size_t sVar7;
  size_t sVar8;
  char *pcVar9;
  char *in_whitespace_end;
  _List_node_base *p_Var10;
  ulong uVar11;
  bool bVar12;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  parameters_split_1;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  parameters_split;
  string local_98;
  size_t local_78;
  ModGroup *local_70;
  undefined8 local_68;
  size_type local_60;
  char *local_58;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_50;
  
  in_whitespace_end = nick._M_str;
  sVar8 = nick._M_len;
  sVar7 = channel._M_len;
  pcVar9 = in_whitespace_end;
  jessilib::
  word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char_const*,char_const*>
            (&local_50,(jessilib *)parameters._M_str,parameters._M_str + parameters._M_len," \t","",
             in_whitespace_end);
  if (local_50.second._M_len == 0) {
    pcVar9 = "Error: Too few parameters. Syntax: add <level> <player>";
    uVar6 = 0x37;
  }
  else {
    local_58 = channel._M_str;
    lVar4 = Jupiter::IRC::Client::getChannel(source,sVar7,channel._M_str);
    if (lVar4 == 0) {
      return;
    }
    Jupiter::IRC::Client::Channel::getType();
    if ((int)*parameters._M_str - 0x30U < 10) {
      jessilib::
      word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char_const*,char_const*>
                ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                  *)&local_98,(jessilib *)parameters._M_str,parameters._M_str + parameters._M_len,
                 " \t","",pcVar9);
      uVar3 = Jupiter_strtoi_s(local_98._M_string_length,local_98._M_dataplus._M_p,0);
      if (((int)uVar3 < 0) ||
         ((int)pluginInstance.groups.
               super__List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
               ._M_impl._M_node._M_size <= (int)uVar3)) {
        Jupiter::IRC::Client::sendNotice
                  (source,sVar8,in_whitespace_end,0x1b,"Error: Invalid group index.");
      }
      else if (pluginInstance.groups.
               super__List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
               ._M_impl._M_node.super__List_node_base._M_next !=
               (_List_node_base *)&pluginInstance.groups &&
               pluginInstance.groups.
               super__List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
               ._M_impl._M_node._M_size != 0) {
        lVar4 = (ulong)uVar3 + 1;
        p_Var10 = pluginInstance.groups.
                  super__List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        do {
          lVar4 = lVar4 + -1;
          if (lVar4 == 0) {
            local_60 = local_98.field_2._M_allocated_capacity;
            local_68 = local_98.field_2._8_8_;
            RenX::getCore();
            lVar4 = RenX::Core::getServerCount();
            if (lVar4 == 0) goto LAB_0010fa38;
            local_70 = (ModGroup *)(p_Var10 + 1);
            bVar2 = false;
            uVar11 = 1;
            local_78 = sVar7;
            goto LAB_0010f864;
          }
          p_Var10 = p_Var10->_M_next;
        } while (p_Var10 != (_List_node_base *)&pluginInstance.groups);
      }
    }
    pcVar9 = "Error: Invalid group.";
    uVar6 = 0x15;
  }
  Jupiter::IRC::Client::sendNotice(source,sVar8,in_whitespace_end,uVar6,pcVar9);
  return;
LAB_0010f864:
  uVar5 = RenX::getCore();
  server = (Server *)RenX::Core::getServer(uVar5);
  cVar1 = RenX::Server::isLogChanType((int)server);
  if (cVar1 != '\0') {
    player = (PlayerInfo *)RenX::Server::getPlayerByPartName(server,local_60,local_68);
    if (player == (PlayerInfo *)0x0) {
      uVar6 = 0x18;
      pcVar9 = "Error: Player not found.";
LAB_0010f97b:
      Jupiter::IRC::Client::sendNotice(source,sVar8,in_whitespace_end,uVar6,pcVar9);
    }
    else {
      if (player->isBot == true) {
        uVar6 = 0x24;
        pcVar9 = "Error: A bot can not be a moderator.";
        goto LAB_0010f97b;
      }
      if ((player->uuid)._M_string_length == 0) {
        uVar6 = 0x1a;
        pcVar9 = "Error: Player has no UUID.";
        goto LAB_0010f97b;
      }
      RenX_ModSystemPlugin::resetAccess(&pluginInstance,player);
      bVar2 = RenX_ModSystemPlugin::set(&pluginInstance,player,local_70);
      if (bVar2) {
        string_printf_abi_cxx11_
                  (&local_98,"%.*s has been added to group \"%.*s\"",(player->name)._M_string_length
                   ,(player->name)._M_dataplus._M_p,p_Var10[6]._M_prev,p_Var10[6]._M_next);
        Jupiter::IRC::Client::sendNotice
                  (source,sVar8,in_whitespace_end,local_98._M_string_length,
                   local_98._M_dataplus._M_p);
      }
      else {
        string_printf_abi_cxx11_
                  (&local_98,"%.*s has been moved to group \"%.*s\"",(player->name)._M_string_length
                   ,(player->name)._M_dataplus._M_p,p_Var10[6]._M_prev,p_Var10[6]._M_next);
        Jupiter::IRC::Client::sendNotice
                  (source,sVar8,in_whitespace_end,local_98._M_string_length,
                   local_98._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      RenX_ModSystemPlugin::auth(&pluginInstance,server,player,false,true);
    }
    bVar2 = true;
  }
  RenX::getCore();
  uVar5 = RenX::Core::getServerCount();
  bVar12 = uVar5 == uVar11;
  uVar11 = (ulong)((int)uVar11 + 1);
  if (bVar12) {
    sVar7 = local_78;
    if (!bVar2) {
LAB_0010fa38:
      Jupiter::IRC::Client::sendMessage
                (source,sVar7,local_58,0x40,
                 "Error: Channel not attached to any connected Renegade X servers.");
    }
    return;
  }
  goto LAB_0010f864;
}

Assistant:

void AddIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	auto parameters_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (parameters_split.second.empty()) {
		source->sendNotice(nick, "Error: Too few parameters. Syntax: add <level> <player>"sv);
		return;
	}

	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr) {
		RenX::Server *server;
		RenX::PlayerInfo *player;
		RenX_ModSystemPlugin::ModGroup *group = nullptr;
		int type = chan->getType();
		bool serverMatch = false;
		std::string_view playerName = parameters;
		if (isdigit(parameters[0])) {
			auto parameters_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
			int index = Jupiter::asInt(parameters_split.first);

			if (index < 0 || index >= static_cast<int>(pluginInstance.groups.size())) {
				source->sendNotice(nick, "Error: Invalid group index."sv);
			}
			else {
				group = pluginInstance.getGroupByIndex(index);
				playerName = parameters_split.second;
			}
		}
		if (group == nullptr)
			source->sendNotice(nick, "Error: Invalid group."sv);
		else {
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++) {
				server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type)) {
					serverMatch = true;
					player = server->getPlayerByPartName(playerName);
					if (player == nullptr)
						source->sendNotice(nick, "Error: Player not found."sv);
					else if (player->isBot)
						source->sendNotice(nick, "Error: A bot can not be a moderator."sv);
					else if (player->uuid.empty())
						source->sendNotice(nick, "Error: Player has no UUID."sv);
					else {
						pluginInstance.resetAccess(*player);
						if (pluginInstance.set(*player, *group))
							source->sendNotice(nick, string_printf("%.*s has been added to group \"%.*s\"", player->name.size(), player->name.data(), group->name.size(), group->name.data()));
						else
							source->sendNotice(nick, string_printf("%.*s has been moved to group \"%.*s\"", player->name.size(), player->name.data(), group->name.size(), group->name.data()));
						pluginInstance.auth(*server, *player, false, true);
					}
				}
			}
			if (serverMatch == false)
				source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		}
	}
}